

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  long lVar1;
  ulong uVar2;
  Literal local_80;
  Literal local_68;
  Literal local_50;
  char local_31;
  
  if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
      (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 1) {
    Literal::Literal(&local_68,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
    operator<<(o,&local_68);
    Literal::~Literal(&local_68);
  }
  else {
    local_31 = '(';
    std::__ostream_insert<char,std::char_traits<char>>(o,&local_31,1);
    if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 0) {
      Literal::Literal(&local_50,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      operator<<(o,&local_50);
      Literal::~Literal(&local_50);
    }
    if (1 < ((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
            (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
      uVar2 = 1;
      lVar1 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
        Literal::Literal(&local_80,
                         (Literal *)
                         ((long)&((literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar1));
        operator<<(o,&local_80);
        Literal::~Literal(&local_80);
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x18;
      } while (uVar2 < ((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                       (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed);
    }
    local_31 = ')';
    o = std::__ostream_insert<char,std::char_traits<char>>(o,&local_31,1);
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  if (literals.size() == 1) {
    return o << literals[0];
  } else {
    o << '(';
    if (literals.size() > 0) {
      o << literals[0];
    }
    for (size_t i = 1; i < literals.size(); ++i) {
      o << ", " << literals[i];
    }
    return o << ')';
  }
}